

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getModuleDeclarationKind(TokenKind kind)

{
  TokenKind kind_local;
  SyntaxKind local_4;
  
  switch(kind) {
  case InterfaceKeyword:
    local_4 = InterfaceDeclaration;
    break;
  default:
    local_4 = Unknown;
    break;
  case MacromoduleKeyword:
    local_4 = ModuleDeclaration;
    break;
  case ModuleKeyword:
    local_4 = ModuleDeclaration;
    break;
  case PackageKeyword:
    local_4 = PackageDeclaration;
    break;
  case ProgramKeyword:
    local_4 = ProgramDeclaration;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleDeclarationKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleDeclaration;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramDeclaration;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceDeclaration;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageDeclaration;
        default: return SyntaxKind::Unknown;
    }
}